

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_session_reset_int(mbedtls_ssl_context *ssl,int partial)

{
  int iVar1;
  
  ssl->state = 0;
  if (ssl->f_set_timer != (mbedtls_ssl_set_timer_t *)0x0) {
    (*ssl->f_set_timer)(ssl->p_timer,0,0);
  }
  ssl->renego_status = 0;
  ssl->renego_records_seen = 0;
  ssl->secure_renegotiation = 0;
  ssl->in_offt = (uchar *)0x0;
  ssl->verify_data_len = 0;
  ssl->own_verify_data[0] = '\0';
  ssl->own_verify_data[1] = '\0';
  ssl->own_verify_data[2] = '\0';
  ssl->own_verify_data[3] = '\0';
  ssl->own_verify_data[4] = '\0';
  ssl->own_verify_data[5] = '\0';
  ssl->own_verify_data[6] = '\0';
  ssl->own_verify_data[7] = '\0';
  *(undefined8 *)(ssl->own_verify_data + 8) = 0;
  ssl->peer_verify_data[4] = '\0';
  ssl->peer_verify_data[5] = '\0';
  ssl->peer_verify_data[6] = '\0';
  ssl->peer_verify_data[7] = '\0';
  ssl->peer_verify_data[8] = '\0';
  ssl->peer_verify_data[9] = '\0';
  ssl->peer_verify_data[10] = '\0';
  ssl->peer_verify_data[0xb] = '\0';
  ssl->in_msg = ssl->in_buf + 0xd;
  ssl->in_msgtype = 0;
  ssl->in_msglen = 0;
  if (partial == 0) {
    ssl->in_left = 0;
  }
  ssl->in_epoch = 0;
  ssl->next_record_offset = 0;
  ssl->in_window_top = 0;
  ssl->in_window = 0;
  ssl->in_hslen = 0;
  ssl->nb_zero = 0;
  ssl->keep_current_message = 0;
  ssl->out_msg = ssl->out_buf + 0xd;
  ssl->out_msgtype = 0;
  ssl->out_msglen = 0;
  ssl->out_left = 0;
  if (ssl->split_done != '\0') {
    ssl->split_done = '\0';
  }
  ssl->transform_in = (mbedtls_ssl_transform *)0x0;
  ssl->transform_out = (mbedtls_ssl_transform *)0x0;
  memset(ssl->out_buf,0,0x414d);
  if (partial == 0) {
    memset(ssl->in_buf,0,0x414d);
  }
  if (ssl->transform != (mbedtls_ssl_transform *)0x0) {
    mbedtls_ssl_transform_free(ssl->transform);
    free(ssl->transform);
    ssl->transform = (mbedtls_ssl_transform *)0x0;
  }
  if (ssl->session != (mbedtls_ssl_session *)0x0) {
    mbedtls_ssl_session_free(ssl->session);
    free(ssl->session);
    ssl->session = (mbedtls_ssl_session *)0x0;
  }
  ssl->alpn_chosen = (char *)0x0;
  if (partial == 0) {
    free(ssl->cli_id);
    ssl->cli_id = (uchar *)0x0;
    ssl->cli_id_len = 0;
  }
  iVar1 = ssl_handshake_init(ssl);
  return iVar1;
}

Assistant:

static int ssl_session_reset_int( mbedtls_ssl_context *ssl, int partial )
{
    int ret;

    ssl->state = MBEDTLS_SSL_HELLO_REQUEST;

    /* Cancel any possibly running timer */
    ssl_set_timer( ssl, 0 );

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->renego_status = MBEDTLS_SSL_INITIAL_HANDSHAKE;
    ssl->renego_records_seen = 0;

    ssl->verify_data_len = 0;
    memset( ssl->own_verify_data, 0, MBEDTLS_SSL_VERIFY_DATA_MAX_LEN );
    memset( ssl->peer_verify_data, 0, MBEDTLS_SSL_VERIFY_DATA_MAX_LEN );
#endif
    ssl->secure_renegotiation = MBEDTLS_SSL_LEGACY_RENEGOTIATION;

    ssl->in_offt = NULL;

    ssl->in_msg = ssl->in_buf + 13;
    ssl->in_msgtype = 0;
    ssl->in_msglen = 0;
    if( partial == 0 )
        ssl->in_left = 0;
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    ssl->next_record_offset = 0;
    ssl->in_epoch = 0;
#endif
#if defined(MBEDTLS_SSL_DTLS_ANTI_REPLAY)
    ssl_dtls_replay_reset( ssl );
#endif

    ssl->in_hslen = 0;
    ssl->nb_zero = 0;

    ssl->keep_current_message = 0;

    ssl->out_msg = ssl->out_buf + 13;
    ssl->out_msgtype = 0;
    ssl->out_msglen = 0;
    ssl->out_left = 0;
#if defined(MBEDTLS_SSL_CBC_RECORD_SPLITTING)
    if( ssl->split_done != MBEDTLS_SSL_CBC_RECORD_SPLITTING_DISABLED )
        ssl->split_done = 0;
#endif

    ssl->transform_in = NULL;
    ssl->transform_out = NULL;

    memset( ssl->out_buf, 0, MBEDTLS_SSL_BUFFER_LEN );
    if( partial == 0 )
        memset( ssl->in_buf, 0, MBEDTLS_SSL_BUFFER_LEN );

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_reset != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_reset()" ) );
        if( ( ret = mbedtls_ssl_hw_record_reset( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_reset", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif

    if( ssl->transform )
    {
        mbedtls_ssl_transform_free( ssl->transform );
        mbedtls_free( ssl->transform );
        ssl->transform = NULL;
    }

    if( ssl->session )
    {
        mbedtls_ssl_session_free( ssl->session );
        mbedtls_free( ssl->session );
        ssl->session = NULL;
    }

#if defined(MBEDTLS_SSL_ALPN)
    ssl->alpn_chosen = NULL;
#endif

#if defined(MBEDTLS_SSL_DTLS_HELLO_VERIFY) && defined(MBEDTLS_SSL_SRV_C)
    if( partial == 0 )
    {
        mbedtls_free( ssl->cli_id );
        ssl->cli_id = NULL;
        ssl->cli_id_len = 0;
    }
#endif

    if( ( ret = ssl_handshake_init( ssl ) ) != 0 )
        return( ret );

    return( 0 );
}